

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  int iVar1;
  TablePrinter *tp;
  Unit UVar2;
  Duration local_78;
  Duration local_68;
  Duration local_58;
  Duration local_48;
  Duration local_38;
  Duration local_28;
  
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0x18])();
  tp = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
  if ((char)iVar1 == '\0') {
    Catch::operator<<(tp);
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    UVar2 = Nanoseconds;
    local_78.m_units = UVar2;
    if (1000.0 <= local_78.m_inNanoseconds) {
      if (1000000.0 <= local_78.m_inNanoseconds) {
        if (1000000000.0 <= local_78.m_inNanoseconds) {
          local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          local_78.m_units = Milliseconds;
        }
      }
      else {
        local_78.m_units = Microseconds;
      }
    }
    Catch::operator<<(tp,&local_78);
    Catch::operator<<(tp);
    local_28.m_inNanoseconds = (stats->mean).lower_bound.__r;
    local_28.m_units = UVar2;
    if (1000.0 <= local_28.m_inNanoseconds) {
      if (1000000.0 <= local_28.m_inNanoseconds) {
        if (1000000000.0 <= local_28.m_inNanoseconds) {
          local_28.m_units = local_28.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          local_28.m_units = Milliseconds;
        }
      }
      else {
        local_28.m_units = Microseconds;
      }
    }
    Catch::operator<<(tp,&local_28);
    Catch::operator<<(tp);
    local_38.m_inNanoseconds = (stats->mean).upper_bound.__r;
    local_38.m_units = UVar2;
    if (1000.0 <= local_38.m_inNanoseconds) {
      if (1000000.0 <= local_38.m_inNanoseconds) {
        if (1000000000.0 <= local_38.m_inNanoseconds) {
          local_38.m_units = local_38.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          local_38.m_units = Milliseconds;
        }
      }
      else {
        local_38.m_units = Microseconds;
      }
    }
    Catch::operator<<(tp,&local_38);
    Catch::operator<<(tp);
    Catch::operator<<(tp);
    local_48.m_inNanoseconds = (stats->standardDeviation).point.__r;
    local_48.m_units = UVar2;
    if (1000.0 <= local_48.m_inNanoseconds) {
      if (1000000.0 <= local_48.m_inNanoseconds) {
        if (1000000000.0 <= local_48.m_inNanoseconds) {
          local_48.m_units = local_48.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          local_48.m_units = Milliseconds;
        }
      }
      else {
        local_48.m_units = Microseconds;
      }
    }
    Catch::operator<<(tp,&local_48);
    Catch::operator<<(tp);
    local_58.m_inNanoseconds = (stats->standardDeviation).lower_bound.__r;
    local_58.m_units = UVar2;
    if (1000.0 <= local_58.m_inNanoseconds) {
      if (1000000.0 <= local_58.m_inNanoseconds) {
        if (1000000000.0 <= local_58.m_inNanoseconds) {
          local_58.m_units = local_58.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          local_58.m_units = Milliseconds;
        }
      }
      else {
        local_58.m_units = Microseconds;
      }
    }
    Catch::operator<<(tp,&local_58);
    Catch::operator<<(tp);
    local_68.m_inNanoseconds = (stats->standardDeviation).upper_bound.__r;
    if (1000.0 <= local_68.m_inNanoseconds) {
      if (1000000.0 <= local_68.m_inNanoseconds) {
        if (1000000000.0 <= local_68.m_inNanoseconds) {
          UVar2 = local_68.m_inNanoseconds < 60000000000.0 ^ Minutes;
        }
        else {
          UVar2 = Milliseconds;
        }
      }
      else {
        UVar2 = Microseconds;
      }
    }
    local_68.m_units = UVar2;
    Catch::operator<<(tp,&local_68);
    Catch::operator<<(tp);
    Catch::operator<<(tp);
    Catch::operator<<(tp);
    Catch::operator<<(tp);
  }
  else {
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    if (1000.0 <= local_78.m_inNanoseconds) {
      if (local_78.m_inNanoseconds < 1000000.0) {
        local_78.m_units = Microseconds;
      }
      else if (local_78.m_inNanoseconds < 1000000000.0) {
        local_78.m_units = Milliseconds;
      }
      else {
        local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
      }
    }
    else {
      local_78.m_units = Nanoseconds;
    }
    Catch::operator<<(tp,&local_78);
  }
  Catch::operator<<(tp);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const& stats) {
    if (m_config->benchmarkNoAnalysis())
    {
        (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
    }
    else
    {
        (*m_tablePrinter) << ColumnBreak()
            << Duration(stats.mean.point.count()) << ColumnBreak()
            << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
            << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
            << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
    }
}